

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O1

Matrix * __thiscall lunasvg::Element::getGlobalMatrix(Matrix *__return_storage_ptr__,Element *this)

{
  SVGNode *pSVar1;
  SVGElement *pSVar2;
  SVGElement *element;
  Transform transform;
  Transform local_50;
  Transform local_38;
  
  pSVar1 = (this->super_Node).m_node;
  if (pSVar1 == (SVGNode *)0x0) {
    __return_storage_ptr__->e = 0.0;
    __return_storage_ptr__->f = 0.0;
    __return_storage_ptr__->a = 1.0;
    __return_storage_ptr__->b = 0.0;
    __return_storage_ptr__->c = 0.0;
    __return_storage_ptr__->d = 1.0;
  }
  else {
    SVGRootElement::updateLayout
              ((SVGRootElement *)
               (pSVar1->m_document->m_rootElement)._M_t.
               super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
               .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>);
    (*pSVar1->_vptr_SVGNode[10])(&local_50,pSVar1);
    pSVar2 = ((this->super_Node).m_node)->m_parentElement;
    if (pSVar2 != (SVGElement *)0x0) {
      do {
        (*(pSVar2->super_SVGNode)._vptr_SVGNode[10])(&local_38,pSVar2);
        Transform::postMultiply(&local_50,&local_38);
        pSVar2 = (pSVar2->super_SVGNode).m_parentElement;
      } while (pSVar2 != (SVGElement *)0x0);
    }
    __return_storage_ptr__->a = local_50.m_matrix.a;
    __return_storage_ptr__->b = local_50.m_matrix.b;
    __return_storage_ptr__->c = local_50.m_matrix.c;
    __return_storage_ptr__->d = local_50.m_matrix.d;
    __return_storage_ptr__->e = local_50.m_matrix.e;
    __return_storage_ptr__->f = local_50.m_matrix.f;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Element::getGlobalMatrix() const
{
    if(m_node == nullptr)
        return Matrix();
    auto transform = element(true)->localTransform();
    for(auto parent = element()->parentElement(); parent; parent = parent->parentElement())
        transform.postMultiply(parent->localTransform());
    return transform;
}